

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infowin_set_name(char *name)

{
  int iVar1;
  char **local_c0;
  char *bp;
  char buf [128];
  XTextProperty tp;
  wchar_t st;
  char *name_local;
  
  local_c0 = &bp;
  my_strcpy((char *)&bp,name,0x80);
  iVar1 = XStringListToTextProperty(&local_c0,1,buf + 0x78);
  if (iVar1 != 0) {
    XSetWMName(Metadpy->dpy,Infowin->win,buf + 0x78);
  }
  XFree(buf._120_8_);
  return 0;
}

Assistant:

static errr Infowin_set_name(const char *name)
{
	Status st;
	XTextProperty tp;
	char buf[128];
	char *bp = buf;
	my_strcpy(buf, name, sizeof(buf));
	st = XStringListToTextProperty(&bp, 1, &tp);
	if (st) XSetWMName(Metadpy->dpy, Infowin->win, &tp);
	XFree(tp.value);
	return (0);
}